

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyDowngradeTypography(TidyDocImpl *doc,Node *node)

{
  byte bVar1;
  Lexer *pLVar2;
  Node *pNVar3;
  Bool BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  tmbstr buf;
  uint c;
  uint local_3c;
  TidyDocImpl *local_38;
  
  if (node != (Node *)0x0) {
    pLVar2 = doc->lexer;
    local_38 = doc;
    do {
      pNVar3 = node->next;
      BVar4 = prvTidynodeIsText(node);
      if (BVar4 != no) {
        uVar8 = (ulong)node->start;
        buf = pLVar2->lexbuf + uVar8;
        while (uVar7 = (uint)uVar8, uVar7 < node->end) {
          bVar1 = pLVar2->lexbuf[uVar8];
          local_3c = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            uVar5 = prvTidyGetUTF8(pLVar2->lexbuf + uVar8,&local_3c);
            uVar7 = uVar7 + uVar5;
          }
          uVar6 = local_3c - 0x2013;
          if ((uVar6 < 0xc) && (uVar6 < 0xc)) {
            if ((0xe0U >> (uVar6 & 0x1f) & 1) == 0) {
              if ((0xe00U >> (uVar6 & 0x1f) & 1) == 0) {
                if ((3U >> (uVar6 & 0x1f) & 1) != 0) {
                  local_3c = 0x2d;
                }
              }
              else {
                local_3c = 0x22;
              }
            }
            else {
              local_3c = 0x27;
            }
          }
          buf = prvTidyPutUTF8(buf,local_3c);
          uVar8 = (ulong)(uVar7 + 1);
        }
        node->end = (int)buf - *(int *)&pLVar2->lexbuf;
      }
      if (node->content != (Node *)0x0) {
        prvTidyDowngradeTypography(local_38,node->content);
      }
      node = pNVar3;
    } while (pNVar3 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(DowngradeTypography)(TidyDocImpl* doc, Node* node)
{
    Node* next;
    Lexer* lexer = doc->lexer;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (unsigned char) lexer->lexbuf[i];

                if (c > 0x7F)
                    i += TY_(GetUTF8)(lexer->lexbuf + i, &c);

                if (c >= 0x2013 && c <= 0x201E)
                {
                    switch (c)
                    {
                    case 0x2013: /* en dash */
                    case 0x2014: /* em dash */
                        c = '-';
                        break;
                    case 0x2018: /* left single  quotation mark */
                    case 0x2019: /* right single quotation mark */
                    case 0x201A: /* single low-9 quotation mark */
                        c = '\'';
                        break;
                    case 0x201C: /* left double  quotation mark */
                    case 0x201D: /* right double quotation mark */
                    case 0x201E: /* double low-9 quotation mark */
                        c = '"';
                        break;
                    }
                }

                p = TY_(PutUTF8)(p, c);
            }

            node->end = p - lexer->lexbuf;
        }

        if (node->content)
            TY_(DowngradeTypography)(doc, node->content);

        node = next;
    }
}